

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.c
# Opt level: O3

int Mig_ManSuppSizeOne(Mig_Obj_t *pObj)

{
  ulong uVar1;
  int iVar2;
  void *__s;
  uint iObj;
  long lVar3;
  int iVar4;
  
  lVar3 = *(long *)((long)pObj + (-0x10 - (ulong)(((uint)pObj->pFans[3] & 0x1ffe) << 3)));
  if (*(long *)(lVar3 + 0x60) == 0) {
    iVar2 = *(int *)(lVar3 + 8);
    uVar1 = (long)iVar2 + 500;
    iVar4 = (int)uVar1;
    if (*(int *)(lVar3 + 0x58) < iVar4) {
      __s = malloc(uVar1 * 4);
      *(void **)(lVar3 + 0x60) = __s;
      if (__s == (void *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      *(int *)(lVar3 + 0x58) = iVar4;
    }
    else {
      __s = (void *)0x0;
    }
    if (-500 < iVar2) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
    }
    *(int *)(lVar3 + 0x5c) = iVar4;
    lVar3 = *(long *)((long)pObj + (-0x10 - (ulong)(((uint)pObj->pFans[3] & 0x1ffe) << 3)));
  }
  *(int *)(lVar3 + 0x54) = *(int *)(lVar3 + 0x54) + 1;
  iObj = (uint)pObj->pFans[3] >> 1;
  iVar2 = Mig_ManSuppSize2_rec
                    (*(Mig_Man_t **)((long)pObj + (-0x10 - (ulong)((iObj & 0xfff) << 4))),iObj);
  return iVar2;
}

Assistant:

int Mig_ManSuppSizeOne( Mig_Obj_t * pObj )
{
    Mig_ObjIncrementTravId( pObj );
//    return Mig_ManSuppSize_rec( pObj );
    return Mig_ManSuppSize2_rec( Mig_ObjMan(pObj), Mig_ObjId(pObj) );
}